

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O0

int is_right_ws_method(_Bool *meth,char *method)

{
  int iVar1;
  char *method_local;
  _Bool *meth_local;
  
  iVar1 = strcmp(method,"GET");
  if (iVar1 == 0) {
    *meth = true;
    meth_local._4_4_ = 1;
  }
  else {
    *meth = false;
    meth_local._4_4_ = -1;
  }
  return meth_local._4_4_;
}

Assistant:

int is_right_ws_method(bool *meth, char *method){
    if(strcmp(method, "GET") == 0){
        *meth = true;
        return 1;
    } else {
        *meth = false;
        return -1;
    }
}